

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp analyze_let_syntax_aux(sexp ctx,sexp x,int recp,int depth)

{
  sexp psVar1;
  sexp env;
  sexp ctx2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_70;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_58.var = &local_70;
  local_70 = (sexp)0x43e;
  local_38.next = &local_58;
  local_38.var = &local_68;
  local_68 = (sexp)0x43e;
  local_48.next = &local_38;
  local_48.var = &local_60;
  local_60 = (sexp)0x43e;
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_38.next;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = &local_48;
  psVar1 = (x->value).type.cpl;
  if ((((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 6)) &&
      (psVar1 = (psVar1->value).type.cpl, ((ulong)psVar1 & 3) == 0)) && (psVar1->tag == 6)) {
    local_70 = sexp_alloc_tagged_aux(ctx,0x28,0x17);
    local_70->field_0x5 = local_70->field_0x5 | 8;
    (local_70->value).flonum = (double)(ctx->value).type.cpl;
    (local_70->value).uvector.length = 0x23e;
    (local_70->value).bytecode.length = 0x23e;
    local_68 = sexp_make_child_context(ctx,(((ctx->value).opcode.methods)->value).type.getters);
    (local_68->value).type.cpl = local_70;
    psVar1 = local_68;
    if (recp == 0) {
      psVar1 = ctx;
    }
    local_60 = analyze_bind_syntax((((x->value).type.cpl)->value).type.name,psVar1,local_68,1);
    if ((((ulong)local_60 & 3) != 0) || (local_60->tag != 0x13)) {
      local_60 = analyze_seq(local_68,(((x->value).type.cpl)->value).type.cpl,depth,1);
    }
  }
  else {
    local_60 = sexp_compile_error(ctx,"bad let(rec)-syntax",x);
  }
  (ctx->value).context.saves = local_58.next;
  return local_60;
}

Assistant:

static sexp analyze_let_syntax_aux (sexp ctx, sexp x, int recp, int depth) {
  sexp res;
  sexp_gc_var3(env, ctx2, tmp);
  sexp_gc_preserve3(ctx, env, ctx2, tmp);
  if (! (sexp_pairp(sexp_cdr(x)) && sexp_pairp(sexp_cddr(x)))) {
    res = sexp_compile_error(ctx, "bad let(rec)-syntax", x);
  } else {
    env = sexp_alloc_type(ctx, env, SEXP_ENV);
    sexp_env_syntactic_p(env) = 1;
    sexp_env_parent(env) = sexp_context_env(ctx);
    sexp_env_bindings(env) = SEXP_NULL;
#if SEXP_USE_STABLE_ABI || SEXP_USE_RENAME_BINDINGS
    sexp_env_renames(env) = SEXP_NULL;
#endif
    ctx2 = sexp_make_child_context(ctx, sexp_context_lambda(ctx));
    sexp_context_env(ctx2) = env;
    tmp = analyze_bind_syntax(sexp_cadr(x), (recp ? ctx2 : ctx), ctx2, 1);
    res = (sexp_exceptionp(tmp) ? tmp : analyze_seq(ctx2, sexp_cddr(x), depth, 1));
  }
  sexp_gc_release3(ctx);
  return res;
}